

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<slang::Diagnostic>::emplace_back<slang::Diagnostic_const&>
          (SmallVectorBase<slang::Diagnostic> *this,Diagnostic *args)

{
  size_type sVar1;
  _Storage<unsigned_long,_true> _Var2;
  SourceLocation SVar3;
  undefined4 uVar4;
  bool bVar5;
  undefined7 uVar6;
  pointer pDVar7;
  
  pDVar7 = this->data_ + this->len;
  if (this->len == this->cap) {
    pDVar7 = emplaceRealloc<slang::Diagnostic_const&>(this,pDVar7,args);
    return pDVar7;
  }
  std::
  vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
  ::vector(&pDVar7->args,&args->args);
  std::vector<slang::SourceRange,_std::allocator<slang::SourceRange>_>::vector
            (&pDVar7->ranges,&args->ranges);
  std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::vector
            (&pDVar7->notes,&args->notes);
  pDVar7->symbol = args->symbol;
  _Var2 = (args->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_payload;
  bVar5 = (args->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_engaged;
  uVar6 = *(undefined7 *)
           &(args->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>.field_0x9;
  uVar4 = *(undefined4 *)&args->field_0x5c;
  SVar3 = args->location;
  pDVar7->code = args->code;
  *(undefined4 *)&pDVar7->field_0x5c = uVar4;
  pDVar7->location = SVar3;
  (pDVar7->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload = _Var2;
  (pDVar7->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = bVar5;
  *(undefined7 *)
   &(pDVar7->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>.field_0x9 = uVar6;
  sVar1 = this->len;
  this->len = sVar1 + 1;
  return this->data_ + sVar1;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }